

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

int Abc_NtkBddToSop(Abc_Ntk_t *pNtk,int fMode,int nCubeLimit)

{
  uint uVar1;
  uint uVar2;
  DdNode *bFuncOn;
  DdNode *pDVar3;
  DdManager *pMan;
  Abc_Obj_t *vCube_00;
  int iVar4;
  int iVar5;
  int nFuncs;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  DdNode **pFuncs;
  int *pGuide;
  char *pcVar8;
  Vec_Ptr_t *vFuncs;
  int nCubes;
  int i;
  DdNode *bFunc;
  DdManager *dd;
  Mem_Flex_t *pManNew;
  Abc_Obj_t *pNode;
  Vec_Str_t *vCube;
  Vec_Int_t *vGuide;
  int nCubeLimit_local;
  int fMode_local;
  Abc_Ntk_t *pNtk_local;
  
  bFunc = (DdNode *)pNtk->pManFunc;
  vGuide._0_4_ = nCubeLimit;
  vGuide._4_4_ = fMode;
  _nCubeLimit_local = pNtk;
  iVar4 = Abc_NtkObjNumMax(pNtk);
  p = Vec_IntAlloc(iVar4);
  vCube = (Vec_Str_t *)p;
  iVar4 = Abc_NtkObjNumMax(_nCubeLimit_local);
  Vec_IntFill(p,iVar4,vGuide._4_4_);
  if ((int)vGuide < 1000000000) {
    iVar4 = Abc_NtkObjNumMax(_nCubeLimit_local);
    p_00 = Vec_PtrStart(iVar4);
    iVar4 = Cudd_ReorderingStatus((DdManager *)bFunc,(Cudd_ReorderingType *)&vFuncs);
    if (iVar4 != 0) {
      __assert_fail("!Cudd_ReorderingStatus(dd, (Cudd_ReorderingType *)&nCubes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                    ,0x178,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
    }
    for (vFuncs._4_4_ = 0; iVar4 = vFuncs._4_4_, iVar5 = Vec_PtrSize(_nCubeLimit_local->vObjs),
        pDVar3 = bFunc, iVar4 < iVar5; vFuncs._4_4_ = vFuncs._4_4_ + 1) {
      pManNew = (Mem_Flex_t *)Abc_NtkObj(_nCubeLimit_local,vFuncs._4_4_);
      if ((((Abc_Obj_t *)pManNew != (Abc_Obj_t *)0x0) &&
          (iVar4 = Abc_ObjIsNode((Abc_Obj_t *)pManNew), iVar4 != 0)) &&
         (iVar4 = Abc_ObjIsBarBuf((Abc_Obj_t *)pManNew), iVar4 == 0)) {
        Vec_PtrWriteEntry(p_00,vFuncs._4_4_,*(void **)(pManNew + 1));
      }
    }
    pFuncs = (DdNode **)Vec_PtrArray(p_00);
    nFuncs = Vec_PtrSize(p_00);
    iVar5 = vGuide._4_4_;
    iVar4 = (int)vGuide;
    pGuide = Vec_IntArray((Vec_Int_t *)vCube);
    vFuncs._0_4_ = Extra_bddCountCubes((DdManager *)pDVar3,pFuncs,nFuncs,iVar5,iVar4,pGuide);
    Vec_PtrFree(p_00);
    if ((int)vFuncs == -1) {
      Vec_IntFree((Vec_Int_t *)vCube);
      return 0;
    }
  }
  iVar4 = Abc_NtkHasBdd(_nCubeLimit_local);
  if (iVar4 == 0) {
    __assert_fail("Abc_NtkHasBdd(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                  ,0x187,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
  }
  if (0 < *(int *)&bFunc[3].type) {
    Cudd_zddVarsFromBddVars((DdManager *)bFunc,2);
  }
  dd = (DdManager *)Mem_FlexStart();
  pNode = (Abc_Obj_t *)Vec_StrAlloc(100);
  vFuncs._4_4_ = 0;
  do {
    iVar4 = vFuncs._4_4_;
    iVar5 = Vec_PtrSize(_nCubeLimit_local->vObjs);
    if (iVar5 <= iVar4) {
      Vec_IntFree((Vec_Int_t *)vCube);
      Vec_StrFree((Vec_Str_t *)pNode);
      _nCubeLimit_local->ntkFunc = ABC_FUNC_SOP;
      _nCubeLimit_local->pManFunc = dd;
      for (vFuncs._4_4_ = 0; iVar4 = vFuncs._4_4_, iVar5 = Vec_PtrSize(_nCubeLimit_local->vObjs),
          iVar4 < iVar5; vFuncs._4_4_ = vFuncs._4_4_ + 1) {
        pManNew = (Mem_Flex_t *)Abc_NtkObj(_nCubeLimit_local,vFuncs._4_4_);
        if ((((Abc_Obj_t *)pManNew != (Abc_Obj_t *)0x0) &&
            (iVar4 = Abc_ObjIsNode((Abc_Obj_t *)pManNew), iVar4 != 0)) &&
           (iVar4 = Abc_ObjIsBarBuf((Abc_Obj_t *)pManNew), iVar4 == 0)) {
          Cudd_RecursiveDeref((DdManager *)bFunc,*(DdNode **)(pManNew + 1));
          *(char **)(pManNew + 1) = pManNew->pCurrent;
          pManNew->pCurrent = (char *)0x0;
        }
      }
      Extra_StopManager((DdManager *)bFunc);
      Abc_NtkSortSops(_nCubeLimit_local);
      return 1;
    }
    pManNew = (Mem_Flex_t *)Abc_NtkObj(_nCubeLimit_local,vFuncs._4_4_);
    if ((((Abc_Obj_t *)pManNew != (Abc_Obj_t *)0x0) &&
        (iVar4 = Abc_ObjIsNode((Abc_Obj_t *)pManNew), iVar4 != 0)) &&
       (iVar4 = Abc_ObjIsBarBuf((Abc_Obj_t *)pManNew), pMan = dd, pDVar3 = bFunc, iVar4 == 0)) {
      if (*(long *)(pManNew + 1) == 0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                      ,0x193,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
      }
      bFuncOn = *(DdNode **)(pManNew + 1);
      _nCubes = bFuncOn;
      iVar4 = Abc_ObjFaninNum((Abc_Obj_t *)pManNew);
      vCube_00 = pNode;
      iVar5 = Vec_IntEntry((Vec_Int_t *)vCube,vFuncs._4_4_);
      pcVar8 = Abc_ConvertBddToSop((Mem_Flex_t *)pMan,(DdManager *)pDVar3,bFuncOn,bFuncOn,iVar4,0,
                                   (Vec_Str_t *)vCube_00,iVar5);
      pManNew->pCurrent = pcVar8;
      if (pManNew->pCurrent == (char *)0x0) {
        Mem_FlexStop((Mem_Flex_t *)dd,0);
        Abc_NtkCleanNext(_nCubeLimit_local);
        Vec_IntFree((Vec_Int_t *)vCube);
        Vec_StrFree((Vec_Str_t *)pNode);
        return 0;
      }
      iVar4 = Abc_SopGetVarNum(pManNew->pCurrent);
      if (iVar4 == 0) {
        pManNew->nChunksAlloc = 0;
      }
      iVar4 = Abc_ObjFaninNum((Abc_Obj_t *)pManNew);
      iVar5 = Abc_SopGetVarNum(pManNew->pCurrent);
      if (iVar4 != iVar5) {
        uVar1 = *(uint *)&pManNew->pEnd;
        uVar2 = *(uint *)((long)&pManNew->pEnd + 4);
        uVar6 = Abc_ObjFaninNum((Abc_Obj_t *)pManNew);
        uVar7 = Abc_SopGetVarNum(pManNew->pCurrent);
        printf("Node %d with level %d has %d fanins but its SOP has support size %d.\n",(ulong)uVar1
               ,(ulong)(uVar2 >> 0xc),(ulong)uVar6,(ulong)uVar7);
        fflush(_stdout);
      }
      iVar4 = Abc_ObjFaninNum((Abc_Obj_t *)pManNew);
      iVar5 = Abc_SopGetVarNum(pManNew->pCurrent);
      if (iVar4 != iVar5) {
        __assert_fail("Abc_ObjFaninNum(pNode) == Abc_SopGetVarNum((char *)pNode->pNext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFunc.c"
                      ,0x1a9,"int Abc_NtkBddToSop(Abc_Ntk_t *, int, int)");
      }
    }
    vFuncs._4_4_ = vFuncs._4_4_ + 1;
  } while( true );
}

Assistant:

int Abc_NtkBddToSop( Abc_Ntk_t * pNtk, int fMode, int nCubeLimit )
{
    Vec_Int_t * vGuide;
    Vec_Str_t * vCube;
    Abc_Obj_t * pNode;
    Mem_Flex_t * pManNew;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    DdNode * bFunc;
    int i, nCubes;

    // compute SOP size
    vGuide = Vec_IntAlloc( Abc_NtkObjNumMax(pNtk) );
    Vec_IntFill( vGuide, Abc_NtkObjNumMax(pNtk), fMode );
    if ( nCubeLimit < ABC_INFINITY )
    {
        // collect all BDDs into one array
        Vec_Ptr_t * vFuncs = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) );
        assert( !Cudd_ReorderingStatus(dd, (Cudd_ReorderingType *)&nCubes) );
        Abc_NtkForEachNode( pNtk, pNode, i )
            if ( !Abc_ObjIsBarBuf(pNode) )
                Vec_PtrWriteEntry( vFuncs, i, pNode->pData );
        // compute the number of cubes in the ISOPs and detemine polarity
        nCubes = Extra_bddCountCubes( dd, (DdNode **)Vec_PtrArray(vFuncs), Vec_PtrSize(vFuncs), fMode, nCubeLimit, Vec_IntArray(vGuide) );
        Vec_PtrFree( vFuncs );
        if ( nCubes == -1 )
        {
            Vec_IntFree( vGuide );
            return 0;
        }
        //printf( "The total number of cubes = %d.\n", nCubes );
    }

    assert( Abc_NtkHasBdd(pNtk) );
    if ( dd->size > 0 )
    Cudd_zddVarsFromBddVars( dd, 2 );
    // create the new manager
    pManNew = Mem_FlexStart();

    // go through the objects
    vCube = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        assert( pNode->pData );
        bFunc = (DdNode *)pNode->pData;
        pNode->pNext = (Abc_Obj_t *)Abc_ConvertBddToSop( pManNew, dd, bFunc, bFunc, Abc_ObjFaninNum(pNode), 0, vCube, Vec_IntEntry(vGuide, i) );
        if ( pNode->pNext == NULL )
        {
            Mem_FlexStop( pManNew, 0 );
            Abc_NtkCleanNext( pNtk );
//            printf( "Converting from BDDs to SOPs has failed.\n" );
            Vec_IntFree( vGuide );
            Vec_StrFree( vCube );
            return 0;
        }
        // it may happen that a constant node was created after structural mapping
        if ( Abc_SopGetVarNum((char *)pNode->pNext) == 0 )
            pNode->vFanins.nSize = 0;
        // check the support
        if ( Abc_ObjFaninNum(pNode) != Abc_SopGetVarNum((char *)pNode->pNext) )
        {
            printf( "Node %d with level %d has %d fanins but its SOP has support size %d.\n", 
                pNode->Id, pNode->Level, Abc_ObjFaninNum(pNode), Abc_SopGetVarNum((char *)pNode->pNext) );
            fflush( stdout );
        }
        assert( Abc_ObjFaninNum(pNode) == Abc_SopGetVarNum((char *)pNode->pNext) );
    }
    Vec_IntFree( vGuide );
    Vec_StrFree( vCube );

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_SOP;
    // set the new manager
    pNtk->pManFunc = pManNew;
    // transfer from next to data
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pData );
        pNode->pData = pNode->pNext;
        pNode->pNext = NULL;
    }

    // check for remaining references in the package
    Extra_StopManager( dd );

    // reorder fanins and cubes to make SOPs more human-readable
    Abc_NtkSortSops( pNtk );
    return 1;
}